

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularPrimitive::
GenerateInlineAccessorDefinitions(SingularPrimitive *this,Printer *p)

{
  char *pcVar1;
  undefined8 uVar2;
  
  io::Printer::Emit(p,0xcf,
                    "\n    inline $Type$ $Msg$::$name$() const {\n      $WeakDescriptorSelfPin$;\n      $annotate_get$;\n      // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n      return _internal_$name_internal$();\n    }\n  "
                   );
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    pcVar1 = 
    "\n      inline void $Msg$::set_$name$($Type$ value) {\n        $WeakDescriptorSelfPin$;\n        $PrepareSplitMessageForWrite$;\n        if ($not_has_field$) {\n          clear_$oneof_name$();\n          set_has_$name_internal$();\n        }\n        $field_$ = value;\n        $annotate_set$;\n        // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n      }\n      inline $Type$ $Msg$::_internal_$name_internal$() const {\n        if ($has_field$) {\n          return $field_$;\n        }\n        return $kDefault$;\n      }\n    "
    ;
    uVar2 = 0x20a;
  }
  else {
    pcVar1 = 
    "\n      inline void $Msg$::set_$name$($Type$ value) {\n        $WeakDescriptorSelfPin$;\n        $PrepareSplitMessageForWrite$;\n        _internal_set_$name_internal$(value);\n        $set_hasbit$;\n        $annotate_set$;\n        // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n      }\n      inline $Type$ $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return $field_$;\n      }\n      inline void $Msg$::_internal_set_$name_internal$($Type$ value) {\n        $TsanDetectConcurrentMutation$;\n        $field_$ = value;\n      }\n    "
    ;
    uVar2 = 0x239;
  }
  io::Printer::Emit(p,uVar2,pcVar1);
  return;
}

Assistant:

void SingularPrimitive::GenerateInlineAccessorDefinitions(
    io::Printer* p) const {
  p->Emit(R"cc(
    inline $Type$ $Msg$::$name$() const {
      $WeakDescriptorSelfPin$;
      $annotate_get$;
      // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
      return _internal_$name_internal$();
    }
  )cc");

  if (is_oneof()) {
    p->Emit(R"cc(
      inline void $Msg$::set_$name$($Type$ value) {
        $WeakDescriptorSelfPin$;
        $PrepareSplitMessageForWrite$;
        if ($not_has_field$) {
          clear_$oneof_name$();
          set_has_$name_internal$();
        }
        $field_$ = value;
        $annotate_set$;
        // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
      }
      inline $Type$ $Msg$::_internal_$name_internal$() const {
        if ($has_field$) {
          return $field_$;
        }
        return $kDefault$;
      }
    )cc");
  } else {
    p->Emit(R"cc(
      inline void $Msg$::set_$name$($Type$ value) {
        $WeakDescriptorSelfPin$;
        $PrepareSplitMessageForWrite$;
        _internal_set_$name_internal$(value);
        $set_hasbit$;
        $annotate_set$;
        // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
      }
      inline $Type$ $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return $field_$;
      }
      inline void $Msg$::_internal_set_$name_internal$($Type$ value) {
        $TsanDetectConcurrentMutation$;
        $field_$ = value;
      }
    )cc");
  }
}